

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O0

int demoCurrentTime(unqlite_vfs *pVfs,Sytm *pOut)

{
  tm *ptVar1;
  tm *pTm;
  time_t tt;
  Sytm *pOut_local;
  unqlite_vfs *pVfs_local;
  
  tt = (time_t)pOut;
  pOut_local = (Sytm *)pVfs;
  time((time_t *)&pTm);
  ptVar1 = gmtime((time_t *)&pTm);
  if (ptVar1 != (tm *)0x0) {
    *(int *)(tt + 8) = ptVar1->tm_hour;
    *(int *)(tt + 4) = ptVar1->tm_min;
    *(int *)tt = ptVar1->tm_sec;
    *(int *)(tt + 0x10) = ptVar1->tm_mon;
    *(int *)(tt + 0xc) = ptVar1->tm_mday;
    *(int *)(tt + 0x14) = ptVar1->tm_year + 0x76c;
    *(int *)(tt + 0x1c) = ptVar1->tm_yday;
    *(int *)(tt + 0x18) = ptVar1->tm_wday;
    *(int *)(tt + 0x20) = ptVar1->tm_isdst;
    *(undefined8 *)(tt + 0x30) = 0;
    *(undefined8 *)(tt + 0x28) = 0;
  }
  return 0;
}

Assistant:

static int demoCurrentTime(unqlite_vfs *pVfs, Sytm *pOut){
	time_t tt;
#if defined(_MSC_VER) || defined(__MINGW32__)
    errno_t err;
    struct tm pTm;
#else
    struct tm *pTm;
#endif  /* defined(_MSC_VER) || defined(__MINGW32__) */
	time(&tt);
#if defined(_MSC_VER) || defined(__MINGW32__)
    err = gmtime_s(&pTm, &tt);
    if ( !err ) {
        STRUCT_TM_TO_SYTM(&pTm,pOut);
    }
#else
	pTm = gmtime(&tt);
	if( pTm ){ /* Yes, it can fail */
		STRUCT_TM_TO_SYTM(pTm,pOut);
	}
#endif  /* defined(_MSC_VER) || defined(__MINGW32__) */
	return UNQLITE_OK;
}